

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_abstract_transaction.cpp
# Opt level: O0

void __thiscall
AbstractTransaction_SetUnlockingScript_Test::TestBody
          (AbstractTransaction_SetUnlockingScript_Test *this)

{
  uint32_t sequence;
  uint32_t index;
  bool bVar1;
  char *pcVar2;
  AssertHelper local_380;
  Message local_378;
  AbstractTxInReference local_370;
  Script local_2e0;
  string local_2a8;
  undefined1 local_288 [8];
  AssertionResult gtest_ar;
  Message local_270;
  allocator local_261;
  string local_260;
  Script local_240;
  AssertHelper local_208;
  Message local_200 [2];
  CfdException *anon_var_0_1;
  string local_1e8;
  Script local_1c8;
  byte local_189;
  char *pcStack_188;
  bool gtest_caught_expected_1;
  ConstCharPtr gtest_msg_1;
  Message local_178 [2];
  CfdException *anon_var_0;
  Script local_160;
  byte local_121;
  char *pcStack_120;
  bool gtest_caught_expected;
  ConstCharPtr gtest_msg;
  string local_110;
  Script local_f0;
  allocator local_a1;
  string local_a0;
  Txid local_80;
  undefined1 local_60 [8];
  Transaction tx;
  uint32_t seq;
  uint32_t vout;
  uint32_t locktime;
  int32_t version;
  AbstractTransaction_SetUnlockingScript_Test *this_local;
  
  tx.vout_.super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  tx.vout_.super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = 0xffffffff;
  cfd::core::Transaction::Transaction((Transaction *)local_60,2,3);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_a0,"e9f71e1f6787f47af671b62f4e29bda856ec3d51a817c62e1cea7f9f0c0190b6",
             &local_a1);
  cfd::core::Txid::Txid(&local_80,&local_a0);
  index = tx.vout_.super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_;
  sequence = (uint32_t)
             tx.vout_.super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_110,"76a914100358d754597ca2f010f6d84f4a0fe74f71f7bb88ac",
             (allocator *)((long)&gtest_msg.value + 7));
  cfd::core::Script::Script(&local_f0,&local_110);
  cfd::core::Transaction::AddTxIn((Transaction *)local_60,&local_80,index,sequence,&local_f0);
  cfd::core::Script::~Script(&local_f0);
  std::__cxx11::string::~string((string *)&local_110);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_msg.value + 7));
  cfd::core::Txid::~Txid(&local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xfffffffffffffee0,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xfffffffffffffee0);
  if (bVar1) {
    local_121 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Script::Script(&local_160);
      cfd::core::Transaction::SetUnlockingScript((Transaction *)local_60,3,&local_160);
      cfd::core::Script::~Script(&local_160);
    }
    if ((local_121 & 1) == 0) {
      pcStack_120 = 
      "Expected: tx.SetUnlockingScript(3, Script()) throws an exception of type CfdException.\n  Actual: it throws nothing."
      ;
      goto LAB_002d5572;
    }
  }
  else {
LAB_002d5572:
    testing::Message::Message(local_178);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_msg_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_abstract_transaction.cpp"
               ,0x95,pcStack_120);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_msg_1,local_178);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_msg_1);
    testing::Message::~Message(local_178);
  }
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xfffffffffffffe78,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xfffffffffffffe78);
  if (bVar1) {
    local_189 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_1e8,"61",(allocator *)((long)&anon_var_0_1 + 7))
      ;
      cfd::core::Script::Script(&local_1c8,&local_1e8);
      cfd::core::Transaction::SetUnlockingScript((Transaction *)local_60,0,&local_1c8);
      cfd::core::Script::~Script(&local_1c8);
      std::__cxx11::string::~string((string *)&local_1e8);
      std::allocator<char>::~allocator((allocator<char> *)((long)&anon_var_0_1 + 7));
    }
    if ((local_189 & 1) != 0) goto LAB_002d588d;
    pcStack_188 = 
    "Expected: tx.SetUnlockingScript(0, Script(\"61\")) throws an exception of type CfdException.\n  Actual: it throws nothing."
    ;
  }
  testing::Message::Message(local_200);
  testing::internal::AssertHelper::AssertHelper
            (&local_208,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_abstract_transaction.cpp"
             ,0x96,pcStack_188);
  testing::internal::AssertHelper::operator=(&local_208,local_200);
  testing::internal::AssertHelper::~AssertHelper(&local_208);
  testing::Message::~Message(local_200);
LAB_002d588d:
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_260,
                 "47304402201934f30b8a2edc4554961b63ca7d540332d5d2f2769727113676b37e4e8ca7c5022076c5bd921d9c08e1c00d58d27bcef918bf025028a9a91f0f545d18a93dda5860012102158a304e6dc2225de38fcd378d6252782085b1f316d6747414ae616d82780763"
                 ,&local_261);
      cfd::core::Script::Script(&local_240,&local_260);
      cfd::core::Transaction::SetUnlockingScript((Transaction *)local_60,0,&local_240);
      cfd::core::Script::~Script(&local_240);
      std::__cxx11::string::~string((string *)&local_260);
      std::allocator<char>::~allocator((allocator<char> *)&local_261);
    }
  }
  else {
    testing::Message::Message(&local_270);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_abstract_transaction.cpp"
               ,0x9c,
               "Expected: tx.SetUnlockingScript( 0, Script( \"47304402201934f30b8a2edc4554961b63ca7d540332d5d2f2769727113676b37e4e8ca7c5022076c5bd921d9c08e1c00d58d27bcef918bf025028a9a91f0f545d18a93dda5860012102158a304e6dc2225de38fcd378d6252782085b1f316d6747414ae616d82780763\")) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar.message_,&local_270);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
    testing::Message::~Message(&local_270);
  }
  cfd::core::Transaction::GetTxIn((TxInReference *)&local_370,(Transaction *)local_60,0);
  cfd::core::AbstractTxInReference::GetUnlockingScript(&local_2e0,&local_370);
  cfd::core::Script::GetHex_abi_cxx11_(&local_2a8,&local_2e0);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_288,"tx.GetTxIn(0).GetUnlockingScript().GetHex().c_str()",
             "\"47304402201934f30b8a2edc4554961b63ca7d540332d5d2f2769727113676b37e4e8ca7c5022076c5bd921d9c08e1c00d58d27bcef918bf025028a9a91f0f545d18a93dda5860012102158a304e6dc2225de38fcd378d6252782085b1f316d6747414ae616d82780763\""
             ,pcVar2,
             "47304402201934f30b8a2edc4554961b63ca7d540332d5d2f2769727113676b37e4e8ca7c5022076c5bd921d9c08e1c00d58d27bcef918bf025028a9a91f0f545d18a93dda5860012102158a304e6dc2225de38fcd378d6252782085b1f316d6747414ae616d82780763"
            );
  std::__cxx11::string::~string((string *)&local_2a8);
  cfd::core::Script::~Script(&local_2e0);
  cfd::core::TxInReference::~TxInReference((TxInReference *)&local_370);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_288);
  if (!bVar1) {
    testing::Message::Message(&local_378);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_288);
    testing::internal::AssertHelper::AssertHelper
              (&local_380,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_abstract_transaction.cpp"
               ,0xa0,pcVar2);
    testing::internal::AssertHelper::operator=(&local_380,&local_378);
    testing::internal::AssertHelper::~AssertHelper(&local_380);
    testing::Message::~Message(&local_378);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_288);
  cfd::core::Transaction::~Transaction((Transaction *)local_60);
  return;
}

Assistant:

TEST(AbstractTransaction, SetUnlockingScript) {
  int32_t version = 2;
  uint32_t locktime = 3;
  uint32_t vout = 0;
  uint32_t seq = 0xffffffff;

  Transaction tx(version, locktime);
  tx.AddTxIn(
      Txid("e9f71e1f6787f47af671b62f4e29bda856ec3d51a817c62e1cea7f9f0c0190b6"),
      vout, seq, Script("76a914100358d754597ca2f010f6d84f4a0fe74f71f7bb88ac"));

  // error
  EXPECT_THROW(tx.SetUnlockingScript(3, Script()), CfdException);
  EXPECT_THROW(tx.SetUnlockingScript(0, Script("61")), CfdException);

  EXPECT_NO_THROW(
      tx.SetUnlockingScript(
          0,
          Script(
              "47304402201934f30b8a2edc4554961b63ca7d540332d5d2f2769727113676b37e4e8ca7c5022076c5bd921d9c08e1c00d58d27bcef918bf025028a9a91f0f545d18a93dda5860012102158a304e6dc2225de38fcd378d6252782085b1f316d6747414ae616d82780763")));

  EXPECT_STREQ(
      tx.GetTxIn(0).GetUnlockingScript().GetHex().c_str(),
      "47304402201934f30b8a2edc4554961b63ca7d540332d5d2f2769727113676b37e4e8ca7c5022076c5bd921d9c08e1c00d58d27bcef918bf025028a9a91f0f545d18a93dda5860012102158a304e6dc2225de38fcd378d6252782085b1f316d6747414ae616d82780763");
}